

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O3

void __thiscall lts2::LBDOperator::drawSelfAsCircles(LBDOperator *this,Mat *destImage)

{
  uint uVar1;
  uint uVar2;
  IntegratingCell *pIVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  float fVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 local_108 [2];
  Mat *local_100;
  undefined8 local_f8;
  LBDOperator *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8;
  int iStack_c4;
  undefined8 uStack_c0;
  undefined8 local_b8;
  int local_b0;
  int iStack_ac;
  undefined8 local_a8;
  int local_a0;
  int iStack_9c;
  float local_98;
  Size local_80;
  _InputArray local_78;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (**(int **)(destImage + 0x40) == 0 && (*(int **)(destImage + 0x40))[1] == 0) {
    local_80 = this->_patchSize;
    cv::Mat::create(destImage,&local_80,0x10);
  }
  local_78.obj = &local_58;
  local_58 = 0x406fe00000000000;
  uStack_50 = 0x406fe00000000000;
  local_48 = 0x406fe00000000000;
  uStack_40 = 0x406fe00000000000;
  local_78.flags = -0x3efdfffa;
  local_78.sz = (Size)&DAT_400000001;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)destImage,&local_78);
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0x406fe00000000000;
  uStack_40 = 0;
  local_78.sz.width = 0;
  local_78.sz.height = 0;
  uStack_60 = 0;
  local_78.flags = 0;
  local_78._4_4_ = 0;
  local_78.obj = (void *)0x0;
  if (*(int *)&(this->super_LinearOperator).field_0xc != 0) {
    uVar8 = 0;
    local_f0 = this;
    do {
      pIVar3 = this->_sensitiveCells;
      uVar1 = this->_basisFunctions[uVar8].pos_cell;
      uVar2 = this->_basisFunctions[uVar8].neg_cell;
      iVar7 = pIVar3[uVar2].xmax;
      iVar5 = pIVar3[uVar2].ymax;
      iStack_c4 = pIVar3[uVar2].ymin;
      local_c8 = (float)pIVar3[uVar2].xmin;
      uStack_c0 = 0;
      local_f8 = 0;
      local_108[0] = 0x3010000;
      auVar16._0_4_ = (float)(local_f0->_patchSize).width;
      auVar16._4_4_ = (float)(local_f0->_patchSize).height;
      auVar16._8_8_ = 0;
      auVar14._0_4_ = (float)pIVar3[uVar1].xmin;
      auVar14._4_4_ = (float)pIVar3[uVar1].ymin;
      auVar14._8_8_ = 0;
      auVar14 = divps(auVar14,auVar16);
      local_d8 = CONCAT44(local_d8._4_4_,(float)(pIVar3[uVar1].ymax + -1) / auVar16._4_4_);
      fVar9 = (float)(int)*(undefined8 *)(destImage + 8);
      fVar13 = (float)(int)((ulong)*(undefined8 *)(destImage + 8) >> 0x20);
      local_e8 = CONCAT44(fVar13,fVar9);
      uStack_e0 = 0;
      local_100 = destImage;
      fVar10 = rintf(fVar13 * ((float)(pIVar3[uVar1].xmax + -1) / auVar16._0_4_));
      local_98 = rintf(fVar13 * auVar14._0_4_);
      fVar9 = rintf(fVar9 * auVar14._4_4_);
      iVar11 = (int)local_98;
      fVar13 = rintf((float)local_d8 * (float)local_e8);
      iVar4 = (int)fVar13 - (int)fVar9;
      iVar6 = (int)fVar10 - iVar11;
      if (iVar4 < iVar6) {
        iVar6 = iVar4;
      }
      iVar6 = iVar6 / 2;
      iVar11 = iVar6 + iVar11;
      iVar4 = iVar6 + (int)fVar9;
      local_a0 = iVar11;
      iStack_9c = iVar4;
      cv::circle(local_108,&local_a0,iVar6,&local_58,1,8,0);
      local_f8 = 0;
      local_108[0] = 0x3010000;
      local_a8 = CONCAT44(iVar4,iVar11);
      local_100 = destImage;
      cv::circle(local_108,&local_a8,1,&local_78,0xffffffff,8,0);
      local_f8 = 0;
      local_108[0] = 0x3010000;
      auVar12._0_4_ = (float)(local_f0->_patchSize).width;
      auVar12._4_4_ = (float)(local_f0->_patchSize).height;
      auVar12._8_8_ = 0;
      auVar15._0_4_ = (float)(int)local_c8;
      auVar15._4_4_ = (float)iStack_c4;
      auVar15._8_4_ = (float)(int)uStack_c0;
      auVar15._12_4_ = (float)uStack_c0._4_4_;
      auVar16 = divps(auVar15,auVar12);
      _local_c8 = CONCAT44(iStack_c4,(float)(iVar5 + -1) / auVar12._4_4_);
      fVar9 = (float)(int)*(undefined8 *)(destImage + 8);
      fVar13 = (float)(int)((ulong)*(undefined8 *)(destImage + 8) >> 0x20);
      local_d8 = CONCAT44(fVar13,fVar9);
      uStack_d0 = 0;
      local_100 = destImage;
      fVar10 = rintf(fVar13 * ((float)(iVar7 + -1) / auVar12._0_4_));
      local_e8._0_4_ = rintf(fVar13 * auVar16._0_4_);
      fVar9 = rintf(fVar9 * auVar16._4_4_);
      iVar6 = (int)(float)local_e8;
      fVar13 = rintf(local_c8 * (float)local_d8);
      iVar5 = (int)fVar13 - (int)fVar9;
      iVar7 = (int)fVar10 - iVar6;
      if (iVar5 < iVar7) {
        iVar7 = iVar5;
      }
      iVar7 = iVar7 / 2;
      iVar6 = iVar7 + iVar6;
      iVar5 = iVar7 + (int)fVar9;
      local_b0 = iVar6;
      iStack_ac = iVar5;
      cv::circle(local_108,&local_b0,iVar7,&local_58,1,8,0);
      this = local_f0;
      local_f8 = 0;
      local_108[0] = 0x3010000;
      local_b8 = CONCAT44(iVar5,iVar6);
      local_100 = destImage;
      cv::circle(local_108,&local_b8,1,&local_78,0xffffffff,8,0);
      uVar8 = uVar8 + 1;
    } while (uVar8 < *(uint *)&(this->super_LinearOperator).field_0xc);
  }
  return;
}

Assistant:

void lts2::LBDOperator::drawSelfAsCircles(cv::Mat &destImage) const
{
  if (destImage.size() == cv::Size(0,0))
    destImage.create(_patchSize, CV_8UC3);
  
  // Fill with white
  destImage.setTo(cv::Scalar::all(255));

  // Shortcuts
  cv::Scalar red = cv::Scalar(0, 0, 255);
  cv::Scalar black = cv::Scalar(0, 0, 0);

  // Loop over the cells
  for (int i = 0; i < this->pairs(); ++i)
  {
    cv::Point center;
    int radius, xmin, xmax, ymin, ymax;
    float n_xmin, n_xmax, n_ymin, n_ymax;

    lbd::IntegratingCell plus = _sensitiveCells[_basisFunctions[i].pos_cell];
    lbd::IntegratingCell minus = _sensitiveCells[_basisFunctions[i].neg_cell];

    // (+) first
    n_xmin = plus.xmin / (float)_patchSize.width;
    n_xmax = (plus.xmax-1) / (float)_patchSize.width;
    n_ymin = plus.ymin / (float)_patchSize.height;
    n_ymax = (plus.ymax -1)/ (float)_patchSize.height;

    xmin = rint(n_xmin * destImage.cols);
    xmax = rint(n_xmax * destImage.cols);
    ymin = rint(n_ymin * destImage.rows);
    ymax = rint(n_ymax * destImage.rows);

    radius = MIN(ymax-ymin,xmax-xmin) / 2;
    center.x = xmin + radius;
    center.y = ymin + radius;

    cv::circle(destImage, center, radius, red);
    cv::circle(destImage, center, 1, black, -1);

    // (-) now
    n_xmin = minus.xmin / (float)_patchSize.width;
    n_xmax = (minus.xmax-1) / (float)_patchSize.width;
    n_ymin = minus.ymin / (float)_patchSize.height;
    n_ymax = (minus.ymax -1)/ (float)_patchSize.height;

    xmin = rint(n_xmin * destImage.cols);
    xmax = rint(n_xmax * destImage.cols);
    ymin = rint(n_ymin * destImage.rows);
    ymax = rint(n_ymax * destImage.rows);

    radius = MIN(ymax-ymin,xmax-xmin) / 2;
    center.x = xmin + radius;
    center.y = ymin + radius;

    cv::circle(destImage, center, radius, red);
    cv::circle(destImage, center, 1, black, -1);
  }
}